

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phrase.h
# Opt level: O3

Indices * __thiscall jhu::thrax::Span::indices(Indices *__return_storage_ptr__,Span *this)

{
  short sVar1;
  pointer psVar2;
  pointer psVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  short sVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  uint uVar14;
  ulong uVar15;
  size_type __n;
  long lVar16;
  int iVar18;
  undefined1 auVar17 [16];
  int iVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  int iVar30;
  int iVar35;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  int iVar36;
  int iVar38;
  undefined1 auVar37 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 in_XMM12 [16];
  undefined1 auVar41 [16];
  allocator_type local_11;
  
  uVar14 = (int)this->end - (int)this->start;
  __n = 0;
  if (0 < (int)uVar14) {
    __n = (size_type)uVar14;
  }
  std::vector<short,_std::allocator<short>_>::vector(__return_storage_ptr__,__n,&local_11);
  auVar13 = _DAT_0014b790;
  auVar12 = _DAT_0014b780;
  auVar11 = _DAT_0014b770;
  auVar10 = _DAT_0014b760;
  auVar9 = _DAT_0014b750;
  psVar2 = (__return_storage_ptr__->super__Vector_base<short,_std::allocator<short>_>)._M_impl.
           super__Vector_impl_data._M_start;
  psVar3 = (__return_storage_ptr__->super__Vector_base<short,_std::allocator<short>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (psVar2 != psVar3) {
    sVar1 = this->start;
    uVar15 = (long)psVar3 + (-2 - (long)psVar2);
    auVar21._8_4_ = (int)uVar15;
    auVar21._0_8_ = uVar15;
    auVar21._12_4_ = (int)(uVar15 >> 0x20);
    auVar17._0_8_ = uVar15 >> 1;
    auVar17._8_8_ = auVar21._8_8_ >> 1;
    lVar16 = 0;
    auVar17 = auVar17 ^ _DAT_0014b790;
    do {
      auVar29._8_4_ = (int)lVar16;
      auVar29._0_8_ = lVar16;
      auVar29._12_4_ = (int)((ulong)lVar16 >> 0x20);
      auVar21 = (auVar29 | auVar12) ^ auVar13;
      iVar30 = auVar17._0_4_;
      iVar36 = -(uint)(iVar30 < auVar21._0_4_);
      iVar18 = auVar17._4_4_;
      auVar22._4_4_ = -(uint)(iVar18 < auVar21._4_4_);
      iVar35 = auVar17._8_4_;
      iVar38 = -(uint)(iVar35 < auVar21._8_4_);
      iVar19 = auVar17._12_4_;
      auVar22._12_4_ = -(uint)(iVar19 < auVar21._12_4_);
      auVar31._4_4_ = iVar36;
      auVar31._0_4_ = iVar36;
      auVar31._8_4_ = iVar38;
      auVar31._12_4_ = iVar38;
      auVar39 = pshuflw(in_XMM11,auVar31,0xe8);
      auVar24._4_4_ = -(uint)(auVar21._4_4_ == iVar18);
      auVar24._12_4_ = -(uint)(auVar21._12_4_ == iVar19);
      auVar24._0_4_ = auVar24._4_4_;
      auVar24._8_4_ = auVar24._12_4_;
      auVar41 = pshuflw(in_XMM12,auVar24,0xe8);
      auVar22._0_4_ = auVar22._4_4_;
      auVar22._8_4_ = auVar22._12_4_;
      auVar21 = pshuflw(auVar39,auVar22,0xe8);
      auVar40._8_4_ = 0xffffffff;
      auVar40._0_8_ = 0xffffffffffffffff;
      auVar40._12_4_ = 0xffffffff;
      auVar40 = (auVar21 | auVar41 & auVar39) ^ auVar40;
      auVar21 = packssdw(auVar40,auVar40);
      sVar8 = (short)lVar16;
      if ((auVar21 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        psVar2[lVar16] = sVar1 + sVar8;
      }
      auVar22 = auVar24 & auVar31 | auVar22;
      auVar21 = packssdw(auVar22,auVar22);
      auVar4._8_4_ = 0xffffffff;
      auVar4._0_8_ = 0xffffffffffffffff;
      auVar4._12_4_ = 0xffffffff;
      auVar21 = packssdw(auVar21 ^ auVar4,auVar21 ^ auVar4);
      if ((auVar21._0_4_ >> 0x10 & 1) != 0) {
        psVar2[lVar16 + 1] = sVar1 + sVar8 + 1;
      }
      auVar21 = (auVar29 | auVar11) ^ auVar13;
      iVar36 = -(uint)(iVar30 < auVar21._0_4_);
      auVar37._4_4_ = -(uint)(iVar18 < auVar21._4_4_);
      iVar38 = -(uint)(iVar35 < auVar21._8_4_);
      auVar37._12_4_ = -(uint)(iVar19 < auVar21._12_4_);
      auVar23._4_4_ = iVar36;
      auVar23._0_4_ = iVar36;
      auVar23._8_4_ = iVar38;
      auVar23._12_4_ = iVar38;
      auVar32._4_4_ = -(uint)(auVar21._4_4_ == iVar18);
      auVar32._12_4_ = -(uint)(auVar21._12_4_ == iVar19);
      auVar32._0_4_ = auVar32._4_4_;
      auVar32._8_4_ = auVar32._12_4_;
      auVar37._0_4_ = auVar37._4_4_;
      auVar37._8_4_ = auVar37._12_4_;
      auVar21 = auVar32 & auVar23 | auVar37;
      auVar21 = packssdw(auVar21,auVar21);
      auVar5._8_4_ = 0xffffffff;
      auVar5._0_8_ = 0xffffffffffffffff;
      auVar5._12_4_ = 0xffffffff;
      auVar21 = packssdw(auVar21 ^ auVar5,auVar21 ^ auVar5);
      if ((auVar21 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        psVar2[lVar16 + 2] = sVar1 + sVar8 + 2;
      }
      auVar40 = pshufhw(auVar23,auVar23,0x84);
      auVar22 = pshufhw(auVar32,auVar32,0x84);
      auVar24 = pshufhw(auVar40,auVar37,0x84);
      auVar25._8_4_ = 0xffffffff;
      auVar25._0_8_ = 0xffffffffffffffff;
      auVar25._12_4_ = 0xffffffff;
      auVar25 = (auVar24 | auVar22 & auVar40) ^ auVar25;
      auVar40 = packssdw(auVar25,auVar25);
      if ((auVar40 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        psVar2[lVar16 + 3] = sVar1 + sVar8 + 3;
      }
      auVar40 = (auVar29 | auVar10) ^ auVar13;
      iVar36 = -(uint)(iVar30 < auVar40._0_4_);
      auVar27._4_4_ = -(uint)(iVar18 < auVar40._4_4_);
      iVar38 = -(uint)(iVar35 < auVar40._8_4_);
      auVar27._12_4_ = -(uint)(iVar19 < auVar40._12_4_);
      auVar33._4_4_ = iVar36;
      auVar33._0_4_ = iVar36;
      auVar33._8_4_ = iVar38;
      auVar33._12_4_ = iVar38;
      auVar21 = pshuflw(auVar21,auVar33,0xe8);
      auVar26._4_4_ = -(uint)(auVar40._4_4_ == iVar18);
      auVar26._12_4_ = -(uint)(auVar40._12_4_ == iVar19);
      auVar26._0_4_ = auVar26._4_4_;
      auVar26._8_4_ = auVar26._12_4_;
      in_XMM12 = pshuflw(auVar41 & auVar39,auVar26,0xe8);
      in_XMM12 = in_XMM12 & auVar21;
      auVar27._0_4_ = auVar27._4_4_;
      auVar27._8_4_ = auVar27._12_4_;
      auVar21 = pshuflw(auVar21,auVar27,0xe8);
      auVar39._8_4_ = 0xffffffff;
      auVar39._0_8_ = 0xffffffffffffffff;
      auVar39._12_4_ = 0xffffffff;
      auVar39 = (auVar21 | in_XMM12) ^ auVar39;
      in_XMM11 = packssdw(auVar39,auVar39);
      if ((in_XMM11 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        psVar2[lVar16 + 4] = sVar1 + sVar8 + 4;
      }
      auVar27 = auVar26 & auVar33 | auVar27;
      auVar21 = packssdw(auVar27,auVar27);
      auVar41._8_4_ = 0xffffffff;
      auVar41._0_8_ = 0xffffffffffffffff;
      auVar41._12_4_ = 0xffffffff;
      auVar21 = packssdw(auVar21 ^ auVar41,auVar21 ^ auVar41);
      if ((auVar21 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
        psVar2[lVar16 + 5] = sVar1 + sVar8 + 5;
      }
      auVar21 = (auVar29 | auVar9) ^ auVar13;
      iVar30 = -(uint)(iVar30 < auVar21._0_4_);
      auVar34._4_4_ = -(uint)(iVar18 < auVar21._4_4_);
      iVar35 = -(uint)(iVar35 < auVar21._8_4_);
      auVar34._12_4_ = -(uint)(iVar19 < auVar21._12_4_);
      auVar28._4_4_ = iVar30;
      auVar28._0_4_ = iVar30;
      auVar28._8_4_ = iVar35;
      auVar28._12_4_ = iVar35;
      auVar20._4_4_ = -(uint)(auVar21._4_4_ == iVar18);
      auVar20._12_4_ = -(uint)(auVar21._12_4_ == iVar19);
      auVar20._0_4_ = auVar20._4_4_;
      auVar20._8_4_ = auVar20._12_4_;
      auVar34._0_4_ = auVar34._4_4_;
      auVar34._8_4_ = auVar34._12_4_;
      auVar21 = auVar20 & auVar28 | auVar34;
      auVar21 = packssdw(auVar21,auVar21);
      auVar6._8_4_ = 0xffffffff;
      auVar6._0_8_ = 0xffffffffffffffff;
      auVar6._12_4_ = 0xffffffff;
      auVar21 = packssdw(auVar21 ^ auVar6,auVar21 ^ auVar6);
      if ((auVar21 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        psVar2[lVar16 + 6] = sVar1 + sVar8 + 6;
      }
      auVar40 = pshufhw(auVar28,auVar28,0x84);
      auVar21 = pshufhw(auVar20,auVar20,0x84);
      auVar29 = pshufhw(auVar40,auVar34,0x84);
      auVar7._8_4_ = 0xffffffff;
      auVar7._0_8_ = 0xffffffffffffffff;
      auVar7._12_4_ = 0xffffffff;
      auVar21 = packssdw(auVar21 & auVar40,(auVar29 | auVar21 & auVar40) ^ auVar7);
      if ((auVar21 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        psVar2[lVar16 + 7] = sVar1 + sVar8 + 7;
      }
      lVar16 = lVar16 + 8;
    } while ((uVar15 >> 4) * 8 + 8 != lVar16);
  }
  return __return_storage_ptr__;
}

Assistant:

auto indices() const {
    Indices result(size());
    std::iota(result.begin(), result.end(), start);
    return result;
  }